

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::FormatSpec>
          (BasicWriter<char> *this,uint num_digits,FormatSpec *spec,char *prefix,uint prefix_size)

{
  byte bVar1;
  uint uVar2;
  Alignment AVar3;
  int iVar4;
  Buffer<char> *pBVar5;
  CharPtr pcVar6;
  size_t size;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t __len_1;
  ulong uVar12;
  size_t __len;
  ulong uVar13;
  ptrdiff_t _Num;
  AlignSpec subspec;
  AlignSpec local_44;
  size_t local_38;
  
  uVar2 = (spec->super_AlignSpec).super_WidthSpec.width_;
  uVar12 = (ulong)uVar2;
  AVar3 = (spec->super_AlignSpec).align_;
  bVar1 = (byte)(spec->super_AlignSpec).super_WidthSpec.fill_;
  iVar4 = spec->precision_;
  if ((int)num_digits < iVar4) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    if (iVar4 < 0) {
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jai1[P]spdlog_example/include/spdlog/fmt/bundled/format.h"
                    ,0x30c,
                    "typename MakeUnsigned<Int>::Type fmt::internal::to_unsigned(Int) [Int = int]");
    }
    uVar9 = iVar4 + prefix_size;
    local_44.super_WidthSpec.fill_ = L'0';
    local_44.align_ = ALIGN_NUMERIC;
    local_44.super_WidthSpec.width_ = uVar9;
    if (uVar2 <= uVar9) {
      pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
      return pcVar6;
    }
    if (this->buffer_->capacity_ < uVar12) {
      (**this->buffer_->_vptr_Buffer)();
    }
    uVar12 = (ulong)(uVar2 - uVar9);
    if (AVar3 != ALIGN_LEFT) {
      pBVar5 = this->buffer_;
      sVar11 = pBVar5->size_;
      uVar13 = sVar11 + uVar12;
      if (pBVar5->capacity_ < uVar13) {
        local_38 = sVar11;
        (**pBVar5->_vptr_Buffer)(pBVar5,uVar13);
        sVar11 = local_38;
      }
      pBVar5->size_ = uVar13;
      if (uVar2 != uVar9) {
        memset(this->buffer_->ptr_ + sVar11,(uint)bVar1,uVar12);
      }
    }
    pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pcVar6;
    }
    pBVar5 = this->buffer_;
    sVar11 = pBVar5->size_;
    uVar13 = sVar11 + uVar12;
    if (pBVar5->capacity_ < uVar13) {
      (**pBVar5->_vptr_Buffer)(pBVar5,uVar13);
    }
    pBVar5->size_ = uVar13;
    if (uVar2 == uVar9) {
      return pcVar6;
    }
    memset(this->buffer_->ptr_ + sVar11,(uint)bVar1,uVar12);
    return pcVar6;
  }
  uVar9 = prefix_size + num_digits;
  pBVar5 = this->buffer_;
  sVar11 = pBVar5->size_;
  if (uVar2 <= uVar9) {
    uVar12 = sVar11 + uVar9;
    if (pBVar5->capacity_ < uVar12) {
      (**pBVar5->_vptr_Buffer)(pBVar5,uVar12);
    }
    pBVar5->size_ = uVar12;
    pcVar8 = this->buffer_->ptr_ + sVar11;
    if (prefix_size != 0) {
      memmove(pcVar8,prefix,(ulong)prefix_size);
    }
    pcVar8 = pcVar8 + uVar9;
    goto LAB_0010c7d8;
  }
  uVar13 = sVar11 + uVar12;
  if (pBVar5->capacity_ < uVar13) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar13);
  }
  uVar10 = (ulong)uVar9;
  pBVar5->size_ = uVar13;
  pcVar7 = this->buffer_->ptr_ + sVar11;
  pcVar8 = pcVar7 + uVar12;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(pcVar7,prefix,(ulong)prefix_size);
      pcVar7 = pcVar7 + prefix_size;
      uVar9 = num_digits;
    }
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar12 = uVar12 - uVar10;
      uVar13 = uVar12 >> 1;
      if (1 < uVar12) {
        memset(pcVar7,(uint)bVar1,uVar13);
      }
      pcVar7 = pcVar7 + uVar13;
      if (uVar2 != uVar9) {
        memset(pcVar7 + uVar10,(uint)bVar1,uVar12 - uVar13);
      }
      if (prefix_size != 0) {
        memmove(pcVar7,prefix,(ulong)prefix_size);
      }
      pcVar8 = pcVar7 + uVar10;
      goto LAB_0010c7d8;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(pcVar7,prefix,(ulong)prefix_size);
      }
      pcVar8 = pcVar7 + uVar10;
      if (uVar2 != uVar9) {
        memset(pcVar8,(uint)bVar1,uVar12 - uVar10);
      }
      goto LAB_0010c7d8;
    }
    if (prefix_size != 0) {
      memmove(pcVar8 + -uVar10,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar8 + (-(long)pcVar7 - (ulong)uVar9) != (char *)0x0) {
    memset(pcVar7,(uint)bVar1,(size_t)(pcVar8 + (-(long)pcVar7 - (ulong)uVar9)));
  }
LAB_0010c7d8:
  return pcVar8 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec, const char *prefix, unsigned prefix_size)
{
    unsigned width = spec.width();
    Alignment align = spec.align();
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.precision() > static_cast<int>(num_digits))
    {
        // Octal prefix '0' is counted as a digit, so ignore it if precision
        // is specified.
        if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
            --prefix_size;
        unsigned number_size = prefix_size + internal::to_unsigned(spec.precision());
        AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
        if (number_size >= width)
            return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        buffer_.reserve(width);
        unsigned fill_size = width - number_size;
        if (align != ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        CharPtr result = prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        if (align == ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        return result;
    }
    unsigned size = prefix_size + num_digits;
    if (width <= size)
    {
        CharPtr p = grow_buffer(size);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        return p + size - 1;
    }
    CharPtr p = grow_buffer(width);
    CharPtr end = p + width;
    if (align == ALIGN_LEFT)
    {
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
        std::uninitialized_fill(p, end, fill);
    }
    else if (align == ALIGN_CENTER)
    {
        p = fill_padding(p, width, size, fill);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
    }
    else
    {
        if (align == ALIGN_NUMERIC)
        {
            if (prefix_size != 0)
            {
                p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
                size -= prefix_size;
            }
        }
        else
        {
            std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
        }
        std::uninitialized_fill(p, end - size, fill);
        p = end;
    }
    return p - 1;
}